

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall
QKmsDevice::parseConnectorProperties(QKmsDevice *this,uint32_t connectorId,QKmsOutput *output)

{
  bool bVar1;
  function<void_(_drmModeProperty_*,_unsigned_long_long)> *this_00;
  uint in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  drmModeObjectPropertiesPtr objProps;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff70;
  PropCallback *in_stack_ffffffffffffffa8;
  drmModeObjectPropertiesPtr in_stack_ffffffffffffffb0;
  QKmsDevice *in_stack_ffffffffffffffb8;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (function<void_(_drmModeProperty_*,_unsigned_long_long)> *)
            drmModeObjectGetProperties(*(undefined4 *)(in_RDI + 0x28),in_ESI,0xc0c0c0c0);
  if (this_00 == (function<void_(_drmModeProperty_*,_unsigned_long_long)> *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    qLcKmsDebug();
    anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_8b5ad::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x118799);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,in_RDI,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (char *)in_stack_ffffffffffffff68,(char *)0x1187af);
      QMessageLogger::debug(local_38,"Failed to query connector %d object properties",(ulong)in_ESI)
      ;
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    std::function<void(_drmModeProperty*,unsigned_long_long)>::
    function<QKmsDevice::parseConnectorProperties(unsigned_int,QKmsOutput*)::__0,void>
              (this_00,(anon_class_8_1_65350a3f *)in_stack_ffffffffffffff68);
    enumerateProperties(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
    std::function<void_(_drmModeProperty_*,_unsigned_long_long)>::~function
              ((function<void_(_drmModeProperty_*,_unsigned_long_long)> *)0x118813);
    drmModeFreeObjectProperties(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKmsDevice::parseConnectorProperties(uint32_t connectorId, QKmsOutput *output)
{
    drmModeObjectPropertiesPtr objProps = drmModeObjectGetProperties(m_dri_fd, connectorId, DRM_MODE_OBJECT_CONNECTOR);
    if (!objProps) {
        qCDebug(qLcKmsDebug, "Failed to query connector %d object properties", connectorId);
        return;
    }

    enumerateProperties(objProps, [output](drmModePropertyPtr prop, quint64 value) {
        Q_UNUSED(value);
        if (!strcasecmp(prop->name, "crtc_id"))
            output->crtcIdPropertyId = prop->prop_id;
    });

    drmModeFreeObjectProperties(objProps);
}